

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O0

void Gia_ManFanoutStart(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  if (p->pFanData == (int *)0x0) {
    iVar1 = Gia_ManObjNum(p);
    p->nFansAlloc = iVar1 << 1;
    if (p->nFansAlloc < 0x1000) {
      p->nFansAlloc = 0x1000;
    }
    piVar2 = (int *)malloc((long)(p->nFansAlloc * 5) << 2);
    p->pFanData = piVar2;
    memset(p->pFanData,0,(long)p->nFansAlloc * 0x14);
    local_1c = 0;
    while( true ) {
      bVar4 = false;
      if (local_1c < p->nObjs) {
        pGStack_18 = Gia_ManObj(p,local_1c);
        bVar4 = pGStack_18 != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      pGVar3 = Gia_ObjChild0(pGStack_18);
      if (pGVar3 != (Gia_Obj_t *)0x0) {
        pGVar3 = Gia_ObjFanin0(pGStack_18);
        Gia_ObjAddFanout(p,pGVar3,pGStack_18);
      }
      pGVar3 = Gia_ObjChild1(pGStack_18);
      if (pGVar3 != (Gia_Obj_t *)0x0) {
        pGVar3 = Gia_ObjFanin1(pGStack_18);
        Gia_ObjAddFanout(p,pGVar3,pGStack_18);
      }
      local_1c = local_1c + 1;
    }
    return;
  }
  __assert_fail("p->pFanData == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFanout.c"
                ,0x47,"void Gia_ManFanoutStart(Gia_Man_t *)");
}

Assistant:

void Gia_ManFanoutStart( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    // allocate fanout datastructure
    assert( p->pFanData == NULL );
    p->nFansAlloc = 2 * Gia_ManObjNum(p);
    if ( p->nFansAlloc < (1<<12) )
        p->nFansAlloc = (1<<12);
    p->pFanData = ABC_ALLOC( int, 5 * p->nFansAlloc );
    memset( p->pFanData, 0, sizeof(int) * 5 * p->nFansAlloc );
    // add fanouts for all objects
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjChild0(pObj) )
            Gia_ObjAddFanout( p, Gia_ObjFanin0(pObj), pObj );
        if ( Gia_ObjChild1(pObj) )
            Gia_ObjAddFanout( p, Gia_ObjFanin1(pObj), pObj );
    }
}